

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::PopulateInterfaceProperty
          (cmExportFileGenerator *this,string *propName,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  char *pcVar1;
  char *__s;
  mapped_type *pmVar2;
  
  __s = cmGeneratorTarget::GetProperty(target,propName);
  if (__s != (char *)0x0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,propName);
    pcVar1 = (char *)pmVar2->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,pcVar1,(ulong)__s);
    return;
  }
  return;
}

Assistant:

void cmExportFileGenerator::PopulateInterfaceProperty(
  const std::string& propName, cmGeneratorTarget* target,
  ImportPropertyMap& properties)
{
  const char* input = target->GetProperty(propName);
  if (input) {
    properties[propName] = input;
  }
}